

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O0

int __thiscall
icu_63::CollationLocaleListEnumeration::clone
          (CollationLocaleListEnumeration *this,__fn *__fn,void *__child_stack,int __flags,
          void *__arg,...)

{
  CollationLocaleListEnumeration *this_00;
  CollationLocaleListEnumeration *local_38;
  CollationLocaleListEnumeration *result;
  CollationLocaleListEnumeration *this_local;
  
  this_00 = (CollationLocaleListEnumeration *)UMemory::operator_new((UMemory *)0x78,(size_t)__fn);
  local_38 = (CollationLocaleListEnumeration *)0x0;
  if (this_00 != (CollationLocaleListEnumeration *)0x0) {
    CollationLocaleListEnumeration(this_00);
    local_38 = this_00;
  }
  if (local_38 != (CollationLocaleListEnumeration *)0x0) {
    *(undefined4 *)&(local_38->super_StringEnumeration).field_0x74 =
         *(undefined4 *)&(this->super_StringEnumeration).field_0x74;
  }
  return (int)local_38;
}

Assistant:

virtual StringEnumeration * clone() const
    {
        CollationLocaleListEnumeration *result = new CollationLocaleListEnumeration();
        if (result) {
            result->index = index;
        }
        return result;
    }